

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Free(Extension *this)

{
  byte bVar1;
  Arena *pAVar2;
  LogMessage *pLVar3;
  string *this_00;
  LogMessage local_68;
  LogFinisher local_29;
  
  bVar1 = this->type;
  if (this->is_repeated == true) {
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_29,pLVar3);
      LogMessage::~LogMessage(&local_68);
    }
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
    case 1:
    case 8:
      this_00 = (string *)(this->field_0).repeated_int32_value;
      if (this_00 == (string *)0x0) {
        return;
      }
      RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_00);
      break;
    case 2:
      this_00 = (string *)(this->field_0).repeated_int64_value;
      if (this_00 == (string *)0x0) {
        return;
      }
      RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_00);
      break;
    case 3:
      this_00 = (string *)(this->field_0).repeated_uint32_value;
      if (this_00 == (string *)0x0) {
        return;
      }
      RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_00);
      break;
    case 4:
      this_00 = (string *)(this->field_0).repeated_uint64_value;
      if (this_00 == (string *)0x0) {
        return;
      }
      RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_00);
      break;
    case 5:
      this_00 = (string *)(this->field_0).repeated_double_value;
      if (this_00 == (string *)0x0) {
        return;
      }
      RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_00);
      break;
    case 6:
      this_00 = (string *)(this->field_0).repeated_float_value;
      if (this_00 == (string *)0x0) {
        return;
      }
      RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_00);
      break;
    case 7:
      this_00 = (string *)(this->field_0).repeated_bool_value;
      if (this_00 == (string *)0x0) {
        return;
      }
      RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_00);
      break;
    case 9:
      this_00 = (string *)(this->field_0).repeated_string_value;
      if (this_00 == (string *)0x0) {
        return;
      }
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)this_00);
      break;
    case 10:
      this_00 = (this->field_0).string_value;
      if (this_00 == (string *)0x0) {
        return;
      }
      RepeatedPtrFieldBase::
      Destroy<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                ((RepeatedPtrFieldBase *)this_00);
      RepeatedPtrFieldBase::~RepeatedPtrFieldBase((RepeatedPtrFieldBase *)this_00);
      break;
    default:
      goto switchD_001499b8_default;
    }
  }
  else {
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
                 ,0x3c);
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_29,pLVar3);
      LogMessage::~LogMessage(&local_68);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
      if ((this->field_0).message_value == (MessageLite *)0x0) {
        return;
      }
      (*((this->field_0).message_value)->_vptr_MessageLite[1])();
      return;
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
      return;
    }
    this_00 = (string *)(this->field_0).repeated_string_value;
    if (this_00 == (string *)0x0) {
      return;
    }
    pAVar2 = (Arena *)(this_00->_M_dataplus)._M_p;
    if (pAVar2 != (Arena *)&this_00->field_2) {
      operator_delete(pAVar2);
    }
  }
  operator_delete(this_00);
switchD_001499b8_default:
  return;
}

Assistant:

void ExtensionSet::Extension::Free() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    delete repeated_##LOWERCASE##_value;    \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    switch (cpp_type(type)) {
      case WireFormatLite::CPPTYPE_STRING:
        delete string_value;
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_lazy) {
          delete lazymessage_value;
        } else {
          delete message_value;
        }
        break;
      default:
        break;
    }
  }
}